

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error assemble_float_immediate(context *ctx,token *token,opcode *op,int bits)

{
  uint32_t uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_0000000c;
  ulong *puVar5;
  ulong uVar6;
  int in_R8D;
  float fVar7;
  token local_58;
  
  puVar5 = (ulong *)CONCAT44(in_register_0000000c,bits);
  uVar1 = op[1].reuse;
  switch(uVar1) {
  case 1:
  case 6:
  case 7:
    if (uVar1 != 1) {
      context::tokenize(&local_58,(context *)token);
      *(int *)&op[2].value = local_58.column;
      op[1].value = (uint64_t)local_58.data.string._M_str;
      op[1].reuse = local_58.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
      op->value = (uint64_t)local_58.filename;
      op->reuse = local_58.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    }
    iVar3 = equal((token *)op,"QNAN");
    if (iVar3 == 0) {
      iVar3 = equal((token *)op,"INF");
      if (iVar3 == 0) goto switchD_0012ebe9_caseD_2;
      fVar7 = INFINITY;
    }
    else {
      fVar7 = NAN;
    }
    if (uVar1 == 7) {
      fVar7 = -fVar7;
    }
    break;
  default:
switchD_0012ebe9_caseD_2:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar2._0_4_ = op->reuse;
    lVar2._4_4_ = op->sched;
    fVar7 = (float)lVar2;
    break;
  case 5:
    fVar7 = (float)*(double *)&op->reuse;
  }
  if (in_R8D == 0x20) {
    uVar6 = (ulong)(uint)fVar7 << 0x14;
    uVar4 = *puVar5;
    if ((uVar4 & uVar6) != 0) goto LAB_0012ed33;
  }
  else {
    if (in_R8D != 0x14) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,0xc4,"error assemble_float_immediate(context &, token &, opcode &, int)");
    }
    uVar4 = (ulong)((uint)fVar7 >> 0xc & 0x7ffff) << 0x14;
    uVar6 = *puVar5;
    if ((uVar6 & uVar4) != 0) {
LAB_0012ed33:
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    uVar4 = uVar4 | uVar6;
    *puVar5 = uVar4;
    if (-1 < (int)fVar7) goto LAB_0012eced;
    if ((uVar6 >> 0x38 & 1) != 0) goto LAB_0012ed33;
    uVar6 = 0x100000000000000;
  }
  *puVar5 = uVar4 | uVar6;
LAB_0012eced:
  context::tokenize(&local_58,(context *)token);
  *(int *)&op[2].value = local_58.column;
  op[1].value = (uint64_t)local_58.data.string._M_str;
  op[1].reuse = local_58.type;
  op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
  op->value = (uint64_t)local_58.filename;
  op->reuse = local_58.data.predicate.index;
  op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_float_immediate(context& ctx, token& token, opcode& op, int bits)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    float value;
    switch (token.type) {
    case token_type::float_immediate:
        value = token.data.float_immediate;
        break;
    case token_type::immediate:
        value = static_cast<float>(token.data.immediate);
        if (static_cast<int64_t>(token.data.immediate) != value) {
            return fail(token, "integer immediate " PRId64 "cannot be represented as float",
                        token.data.immediate);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = std::numeric_limits<float>::quiet_NaN();
        } else if (equal(token, "INF")) {
            value = std::numeric_limits<float>::infinity();
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            value = -value;
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    uint32_t raw;
    std::memcpy(&raw, &value, sizeof(raw));
    if (bits == 20) {
        // TODO: add a setting to warn/error precision losses
        // if ((raw >> 12) << 12 != raw) ...
        op.add_bits(static_cast<uint64_t>((raw << 1) >> 13) << 20);
        if (raw >> 31 != 0) {
            op.add_bits(1ULL << 56);
        }
    } else if (bits == 32) {
        op.add_bits(static_cast<uint64_t>(raw) << 20);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}